

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::FloatVector::ByteSizeLong(FloatVector *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  int value;
  
  uVar2 = (ulong)(uint)(this->vector_).current_size_;
  lVar1 = uVar2 * 4;
  if (uVar2 == 0) {
    value = 0;
    lVar4 = 0;
  }
  else {
    value = (int)lVar1;
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value);
    lVar4 = sVar3 + 1;
  }
  this->_vector_cached_byte_size_ = value;
  sVar3 = lVar4 + lVar1;
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t FloatVector::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.FloatVector)
  size_t total_size = 0;

  // repeated float vector = 1;
  {
    unsigned int count = this->vector_size();
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _vector_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}